

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_functional_test.cc
# Opt level: O0

void * db_compact_during_doc_delete(void *args)

{
  fdb_status fVar1;
  size_t metalen;
  void *meta;
  fdb_kvs_handle *in_stack_fffffffffffff6a8;
  fdb_file_handle *in_stack_fffffffffffff6b0;
  fdb_doc **in_stack_fffffffffffff6b8;
  size_t in_stack_fffffffffffff6d0;
  fdb_doc *in_stack_fffffffffffff700;
  fdb_kvs_handle *in_stack_fffffffffffff708;
  fdb_kvs_info *in_stack_fffffffffffff810;
  fdb_kvs_handle *in_stack_fffffffffffff818;
  fdb_config *in_stack_fffffffffffff8c8;
  char *in_stack_fffffffffffff8d0;
  fdb_file_handle **in_stack_fffffffffffff8d8;
  undefined1 local_5f8 [248];
  fdb_file_handle *local_500;
  fdb_kvs_config local_4f8;
  char bodybuf [256];
  char metabuf [256];
  char keybuf [256];
  fdb_doc **doc;
  void *thread_ret;
  pthread_t tid;
  fdb_kvs_info kvs_info;
  fdb_kvs_config kvs_config;
  fdb_config fconfig;
  fdb_kvs_handle *pfStack_88;
  fdb_status status;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  int n;
  int r;
  int i;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  void *args_local;
  
  gettimeofday((timeval *)&__test_prev.tv_usec,(__timezone_ptr_t)0x0);
  memleak_start();
  fdb_get_default_kvs_config();
  kvs_info.file = local_500;
  kvs_config.create_if_missing = local_4f8.create_if_missing;
  kvs_config._1_7_ = local_4f8._1_7_;
  kvs_config.custom_cmp = local_4f8.custom_cmp;
  fdb_get_default_config();
  memcpy(&kvs_config.custom_cmp_param,local_5f8,0xf8);
  if (args != (void *)0x0) {
    fVar1 = fdb_open(in_stack_fffffffffffff8d8,in_stack_fffffffffffff8d0,in_stack_fffffffffffff8c8);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
              ,0x60f);
      db_compact_during_doc_delete::__test_pass = 0;
      if (fVar1 != FDB_RESULT_SUCCESS) {
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                      ,0x60f,"void *db_compact_during_doc_delete(void *)");
      }
    }
    fVar1 = fdb_compact(in_stack_fffffffffffff6b0,(char *)in_stack_fffffffffffff6a8);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
              ,0x611);
      db_compact_during_doc_delete::__test_pass = 0;
      if (fVar1 != FDB_RESULT_SUCCESS) {
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                      ,0x611,"void *db_compact_during_doc_delete(void *)");
      }
    }
    fdb_close((fdb_file_handle *)in_stack_fffffffffffff6a8);
    pthread_exit((void *)0x0);
  }
  system("rm -rf  compact_test* > errorlog.txt");
  fVar1 = fdb_open(in_stack_fffffffffffff8d8,in_stack_fffffffffffff8d0,in_stack_fffffffffffff8c8);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0x5d0);
    db_compact_during_doc_delete::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0x5d0,"void *db_compact_during_doc_delete(void *)");
    }
  }
  fVar1 = fdb_kvs_open_default
                    (in_stack_fffffffffffff6b0,(fdb_kvs_handle **)in_stack_fffffffffffff6a8,
                     (fdb_kvs_config *)0x10ba85);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0x5d2);
    db_compact_during_doc_delete::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0x5d2,"void *db_compact_during_doc_delete(void *)");
    }
  }
  for (n = 0; n < 100; n = n + 1) {
    sprintf(metabuf + 0xf8,"key%d",(ulong)(uint)n);
    sprintf(bodybuf + 0xf8,"meta%d",(ulong)(uint)n);
    sprintf((char *)&local_4f8.custom_cmp_param,"body%d",(ulong)(uint)n);
    strlen(metabuf + 0xf8);
    strlen(bodybuf + 0xf8);
    meta = (void *)0x10bbbe;
    metalen = strlen((char *)&local_4f8.custom_cmp_param);
    fdb_doc_create(in_stack_fffffffffffff6b8,in_stack_fffffffffffff6b0,
                   (size_t)in_stack_fffffffffffff6a8,meta,metalen,(void *)0x10bbf5,
                   in_stack_fffffffffffff6d0);
    fdb_set(pfStack_88,*(fdb_doc **)(&stack0xfffffffffffff6a8 + (long)n * 8));
  }
  fdb_commit((fdb_file_handle *)in_stack_fffffffffffff6a8,'\0');
  fdb_get_kvs_info(in_stack_fffffffffffff818,in_stack_fffffffffffff810);
  if (kvs_info.last_seqnum != 100) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0x5e1);
    db_compact_during_doc_delete::__test_pass = 0;
    if (kvs_info.last_seqnum != 100) {
      __assert_fail("kvs_info.doc_count == (uint64_t)n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0x5e1,"void *db_compact_during_doc_delete(void *)");
    }
  }
  for (n = 0; n < 100; n = n + 1) {
    fdb_del(in_stack_fffffffffffff708,in_stack_fffffffffffff700);
    if (n == 0x32) {
      pthread_create((pthread_t *)&thread_ret,(pthread_attr_t *)0x0,db_compact_during_doc_delete,db)
      ;
    }
  }
  pthread_join((pthread_t)thread_ret,&doc);
  fdb_commit((fdb_file_handle *)in_stack_fffffffffffff6a8,'\0');
  fdb_get_kvs_info(in_stack_fffffffffffff818,in_stack_fffffffffffff810);
  if (kvs_info.last_seqnum != 0) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0x5f3);
    db_compact_during_doc_delete::__test_pass = 0;
    if (kvs_info.last_seqnum != 0) {
      __assert_fail("kvs_info.doc_count == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0x5f3,"void *db_compact_during_doc_delete(void *)");
    }
  }
  fdb_kvs_close(in_stack_fffffffffffff6a8);
  fdb_close((fdb_file_handle *)in_stack_fffffffffffff6a8);
  fVar1 = fdb_open(in_stack_fffffffffffff8d8,in_stack_fffffffffffff8d0,in_stack_fffffffffffff8c8);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0x5f9);
    db_compact_during_doc_delete::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0x5f9,"void *db_compact_during_doc_delete(void *)");
    }
  }
  fVar1 = fdb_kvs_open_default
                    (in_stack_fffffffffffff6b0,(fdb_kvs_handle **)in_stack_fffffffffffff6a8,
                     (fdb_kvs_config *)0x10be56);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0x5fb);
    db_compact_during_doc_delete::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0x5fb,"void *db_compact_during_doc_delete(void *)");
    }
  }
  fdb_get_kvs_info(in_stack_fffffffffffff818,in_stack_fffffffffffff810);
  if (kvs_info.last_seqnum != 0) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0x5fe);
    db_compact_during_doc_delete::__test_pass = 0;
    if (kvs_info.last_seqnum != 0) {
      __assert_fail("kvs_info.doc_count == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0x5fe,"void *db_compact_during_doc_delete(void *)");
    }
  }
  for (n = 0; n < 100; n = n + 1) {
    fdb_doc_free((fdb_doc *)0x10bf57);
  }
  fdb_kvs_close(in_stack_fffffffffffff6a8);
  fdb_close((fdb_file_handle *)in_stack_fffffffffffff6a8);
  fdb_shutdown();
  memleak_end();
  if (db_compact_during_doc_delete::__test_pass == 0) {
    fprintf(_stderr,"%s FAILED\n","multi thread client shutdown");
  }
  else {
    fprintf(_stderr,"%s PASSED\n","multi thread client shutdown");
  }
  return (void *)0x0;
}

Assistant:

void *db_compact_during_doc_delete(void *args)
{

    TEST_INIT();
    memleak_start();

    int i, r;
    int n = 100;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_status status;
    fdb_config fconfig;
    fdb_kvs_config kvs_config;
    fdb_kvs_info kvs_info;
    thread_t tid;
    void *thread_ret;
    fdb_doc **doc = alca(fdb_doc*, n);
    char keybuf[256], metabuf[256], bodybuf[256];

    // init dbfile
    kvs_config = fdb_get_default_kvs_config();
    fconfig = fdb_get_default_config();
    fconfig.buffercache_size = 0;
    fconfig.wal_threshold = 1024;
    fconfig.compaction_threshold = 0;

    if (args == NULL)
    { // parent

        r = system(SHELL_DEL" compact_test* > errorlog.txt");
        (void)r;

        status = fdb_open(&dbfile, "./compact_test1", &fconfig);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        status = fdb_kvs_open_default(dbfile, &db, &kvs_config);
        TEST_CHK(status == FDB_RESULT_SUCCESS);

        // insert documents
        for (i=0;i<n;++i){
            sprintf(keybuf, "key%d", i);
            sprintf(metabuf, "meta%d", i);
            sprintf(bodybuf, "body%d", i);
            fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
                (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
            fdb_set(db, doc[i]);
        }

        fdb_commit(dbfile, FDB_COMMIT_NORMAL);
        // verify no docs remaining
        fdb_get_kvs_info(db, &kvs_info);
        TEST_CHK(kvs_info.doc_count == (uint64_t)n);

        // start deleting docs
        for (i=0;i<n;++i){
            fdb_del(db, doc[i]);
            if (i == n/2){
                // compact half-way
                thread_create(&tid, db_compact_during_doc_delete, (void *)dbfile);
            }
        }

        // join compactor
        thread_join(tid, &thread_ret);

        fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

        // verify no docs remaining
        fdb_get_kvs_info(db, &kvs_info);
        TEST_CHK(kvs_info.doc_count == 0);

        // reopen
        fdb_kvs_close(db);
        fdb_close(dbfile);
        status = fdb_open(&dbfile, "./compact_test1", &fconfig);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        status = fdb_kvs_open_default(dbfile, &db, &kvs_config);
        TEST_CHK(status == FDB_RESULT_SUCCESS);

        fdb_get_kvs_info(db, &kvs_info);
        TEST_CHK(kvs_info.doc_count == 0);

        // cleanup
        for (i=0;i<n;++i){
            fdb_doc_free(doc[i]);
        }
        fdb_kvs_close(db);
        fdb_close(dbfile);
        fdb_shutdown();

        memleak_end();
        TEST_RESULT("multi thread client shutdown");
        return NULL;
    }

    // compaction thread enters here //
    status = fdb_open(&dbfile, "./compact_test1", &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_compact(dbfile, NULL);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    fdb_close(dbfile);

    // shutdown
    thread_exit(0);
    return NULL;
}